

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cc
# Opt level: O3

int bio_free(BIO *bio)

{
  long *orig_ptr;
  long lVar1;
  long *plVar2;
  void *orig_ptr_00;
  
  orig_ptr = (long *)bio->ptr;
  if (orig_ptr == (long *)0x0) {
    __assert_fail("b != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                  ,0x5e,"int bio_free(BIO *)");
  }
  lVar1 = *orig_ptr;
  if (lVar1 == 0) {
    orig_ptr_00 = (void *)orig_ptr[5];
  }
  else {
    plVar2 = *(long **)(lVar1 + 0x28);
    if (plVar2 == (long *)0x0) {
      __assert_fail("peer_b != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x4b,"void bio_destroy_pair(BIO *)");
    }
    if ((BIO *)*plVar2 != bio) {
      __assert_fail("peer_b->peer == bio",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x4c,"void bio_destroy_pair(BIO *)");
    }
    *plVar2 = 0;
    *(undefined4 *)(lVar1 + 0x10) = 0;
    if (plVar2[5] == 0) {
      __assert_fail("peer_b->buf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x50,"void bio_destroy_pair(BIO *)");
    }
    plVar2[2] = 0;
    plVar2[3] = 0;
    *orig_ptr = 0;
    bio->init = 0;
    orig_ptr_00 = (void *)orig_ptr[5];
    if (orig_ptr_00 == (void *)0x0) {
      __assert_fail("b->buf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x56,"void bio_destroy_pair(BIO *)");
    }
    orig_ptr[2] = 0;
    orig_ptr[3] = 0;
  }
  OPENSSL_free(orig_ptr_00);
  OPENSSL_free(orig_ptr);
  return 1;
}

Assistant:

static int bio_free(BIO *bio) {
  struct bio_bio_st *b = reinterpret_cast<bio_bio_st *>(bio->ptr);

  assert(b != NULL);

  if (b->peer) {
    bio_destroy_pair(bio);
  }

  OPENSSL_free(b->buf);
  OPENSSL_free(b);

  return 1;
}